

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

cio_error send_frame(cio_websocket *websocket,cio_websocket_write_job *job,size_t frame_length)

{
  uint8_t *mask_00;
  cio_write_buffer *wbh;
  uint16_t uVar1;
  cio_error cVar2;
  undefined8 in_RAX;
  uint64_t uVar3;
  byte bVar4;
  size_t mask_length;
  byte bVar5;
  size_t sStack_40;
  uint8_t mask [4];
  
  mask = SUB84((ulong)in_RAX >> 0x20,0);
  if (job->is_continuation_chunk == false) {
    bVar4 = (byte)job->frame_type;
    bVar5 = bVar4 | 0x80;
    if (job->last_frame == false) {
      bVar5 = bVar4;
    }
    job->send_header[0] = bVar5;
    if (frame_length < 0x7e) {
      sStack_40 = 2;
      bVar5 = (byte)frame_length;
    }
    else if (frame_length < 0x10000) {
      uVar1 = cio_htobe16((uint16_t)frame_length);
      *(uint16_t *)(job->send_header + 2) = uVar1;
      bVar5 = 0x7e;
      sStack_40 = 4;
    }
    else {
      uVar3 = cio_htobe64(frame_length);
      *(uint64_t *)(job->send_header + 2) = uVar3;
      bVar5 = 0x7f;
      sStack_40 = 10;
    }
    if (((websocket->ws_private).ws_flags.field_0x1 & 4) == 0) {
      cio_random_get_bytes(&(websocket->ws_private).rng,mask,4);
      *(uint8_t (*) [4])(job->send_header + sStack_40) = mask;
      mask_write_buffer(job->wbh,mask,mask_length);
      if ((job->wbh->data).element.length < frame_length) {
        *&(websocket->ws_private).chunk_send_mask = mask;
      }
      bVar5 = bVar5 | 0x80;
      sStack_40 = sStack_40 + 4;
    }
    job->send_header[1] = bVar5;
    (job->websocket_header).data.head.q_len = (size_t)job->send_header;
    (job->websocket_header).data.element.length = sStack_40;
    wbh = job->wbh;
    cio_write_buffer_insert(wbh,&job->websocket_header,wbh,wbh->next);
    cVar2 = cio_buffered_stream_write
                      (&((websocket->ws_private).http_client)->buffered_stream,job->wbh,
                       job->stream_handler,websocket);
    return cVar2;
  }
  if (((websocket->ws_private).ws_flags.field_0x1 & 4) == 0) {
    mask_00 = (websocket->ws_private).chunk_send_mask;
    mask_write_buffer(job->wbh,mask_00,frame_length);
    cio_websocket_correct_mask(mask_00,(job->wbh->data).element.length);
  }
  cVar2 = cio_buffered_stream_write
                    (&((websocket->ws_private).http_client)->buffered_stream,job->wbh,
                     job->stream_handler,websocket);
  return cVar2;
}

Assistant:

static enum cio_error send_frame(struct cio_websocket *websocket, struct cio_websocket_write_job *job, size_t frame_length)
{
	if (!job->is_continuation_chunk) {
		uint8_t first_len = 0;
		size_t header_index = 2;

		uint8_t first_byte = (uint8_t)job->frame_type;
		if (job->last_frame) {
			first_byte |= WS_HEADER_FIN;
		}

		job->send_header[0] = first_byte;

		if (frame_length <= CIO_WEBSOCKET_SMALL_FRAME_SIZE) {
			first_len = (uint8_t)frame_length;
		} else if (frame_length <= WS_MID_FRAME_SIZE) {
			uint16_t be_len = cio_htobe16((uint16_t)frame_length);
			memcpy(&job->send_header[2], &be_len, sizeof(be_len));
			header_index += sizeof(be_len);
			first_len = CIO_WEBSOCKET_SMALL_FRAME_SIZE + 1;
		} else {
			uint64_t be_len = cio_htobe64((uint64_t)frame_length);
			memcpy(&job->send_header[2], &be_len, sizeof(be_len));
			header_index += sizeof(be_len);
			first_len = CIO_WEBSOCKET_SMALL_FRAME_SIZE + 2;
		}

		if (websocket->ws_private.ws_flags.is_server == 0U) {
			first_len |= WS_MASK_SET;
			uint8_t mask[4];
			cio_random_get_bytes(&websocket->ws_private.rng, mask, sizeof(mask));
			memcpy(&job->send_header[header_index], &mask, sizeof(mask));

			header_index += sizeof(mask);
			mask_write_buffer(job->wbh, mask, sizeof(mask));

			size_t job_length = cio_write_buffer_get_total_size(job->wbh);
			if (job_length < frame_length) {
				memcpy(websocket->ws_private.chunk_send_mask, mask, sizeof(mask));
			}
		}

		job->send_header[1] = first_len;

		cio_write_buffer_element_init(&job->websocket_header, job->send_header, header_index);
		add_websocket_header(job);
		struct cio_http_client *client = websocket->ws_private.http_client;
		return cio_buffered_stream_write(&client->buffered_stream, job->wbh, job->stream_handler, websocket);
	}

	if (websocket->ws_private.ws_flags.is_server == 0U) {
		mask_write_buffer(job->wbh, websocket->ws_private.chunk_send_mask, sizeof(websocket->ws_private.chunk_send_mask));
		size_t job_length = cio_write_buffer_get_total_size(job->wbh);
		cio_websocket_correct_mask(websocket->ws_private.chunk_send_mask, job_length);
	}

	struct cio_http_client *client = websocket->ws_private.http_client;
	return cio_buffered_stream_write(&client->buffered_stream, job->wbh, job->stream_handler, websocket);
}